

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O1

void __thiscall menuwindow::drawentry(menuwindow *this,Fl_Menu_Item *m,int n,int eraseit)

{
  int h;
  int x;
  int y;
  menuwindow *pmVar1;
  char *str;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int w;
  int iVar10;
  char *k;
  
  if (m != (Fl_Menu_Item *)0x0) {
    x = Fl::box_dx((uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                         super_Fl_Group.super_Fl_Widget.box_);
    iVar4 = (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
            super_Fl_Widget.w_ + x * -2;
    iVar10 = this->itemheight;
    w = iVar4 + -1;
    y = iVar10 * n + x + 1;
    h = iVar10 + -4;
    if ((eraseit != 0) && (this->selected != n)) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,(ulong)(x + 1),(ulong)(uint)(iVar10 * n + x),(ulong)(iVar4 - 3),
                 (ulong)(iVar10 - 2));
      pmVar1 = (menuwindow *)button;
      if (button == (Fl_Menu_ *)0x0) {
        pmVar1 = this;
      }
      Fl_Widget::draw_box((Fl_Widget *)this,
                          (uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                                super_Fl_Group.super_Fl_Widget.box_,0,0,
                          (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                          super_Fl_Group.super_Fl_Widget.w_,
                          (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                          super_Fl_Group.super_Fl_Widget.h_,
                          (pmVar1->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                          super_Fl_Group.super_Fl_Widget.color_);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    }
    Fl_Menu_Item::draw(m,x,y,w,h,button,(uint)(this->selected == n));
    if ((m->flags & 0x60) == 0) {
      if (m->shortcut_ != 0) {
        uVar5 = m->labelsize_;
        uVar8 = (ulong)uVar5;
        if ((uVar5 == 0) && (m->labelfont_ == 0)) {
          if (button == (Fl_Menu_ *)0x0) {
            uVar9 = 0;
          }
          else {
            uVar9 = (ulong)(uint)button->textfont_;
          }
        }
        else {
          uVar9 = (ulong)(uint)m->labelfont_;
        }
        if (uVar5 == 0) {
          if (button == (Fl_Menu_ *)0x0) {
            uVar8 = (ulong)(uint)FL_NORMAL_SIZE;
          }
          else {
            uVar8 = (ulong)(uint)button->textsize_;
          }
        }
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
                  (fl_graphics_driver,uVar9,uVar8);
        str = fl_shortcut_label(m->shortcut_,&k);
        pcVar3 = k;
        sVar2 = strlen(k);
        iVar10 = fl_utf_nb_char((uchar *)pcVar3,(int)sVar2);
        if (iVar10 < 5) {
          sVar2 = (long)k - (long)str;
          pcVar3 = (char *)malloc(sVar2 + 1);
          memcpy(pcVar3,str,sVar2);
          pcVar3[sVar2] = '\0';
          fl_draw(pcVar3,x,y,w - this->shortcutWidth,h,8,(Fl_Image *)0x0,1);
          fl_draw(k,(w + x) - this->shortcutWidth,y,this->shortcutWidth,h,4,(Fl_Image *)0x0,1);
          free(pcVar3);
        }
        else {
          fl_draw(str,x,y,iVar4 + -5,h,8,(Fl_Image *)0x0,1);
        }
      }
    }
    else {
      uVar5 = iVar10 - 0xbU & 0xfffffffe;
      uVar7 = (int)(h - uVar5) / 2 + y;
      uVar6 = ~uVar5 + w + x;
      iVar10 = (int)(iVar10 - 0xbU) >> 1;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
                (fl_graphics_driver,(ulong)uVar6,(ulong)uVar7,(ulong)uVar6,(ulong)(uVar7 + uVar5),
                 (ulong)(uVar6 + iVar10),(ulong)(iVar10 + uVar7));
    }
    if ((m->flags & 0x80) != 0) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x27);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                (fl_graphics_driver,(ulong)(x - 1U),(ulong)(y + h + 1),(ulong)(iVar4 + 2U));
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x36);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                (fl_graphics_driver,(ulong)(x - 1U),(ulong)(y + h + 2),(ulong)(iVar4 + 2U));
    }
  }
  return;
}

Assistant:

void menuwindow::drawentry(const Fl_Menu_Item* m, int n, int eraseit) {
  if (!m) return; // this happens if -1 is selected item and redrawn

  int BW = Fl::box_dx(box());
  int xx = BW;
  int W = w();
  int ww = W-2*BW-1;
  int yy = BW+1+n*itemheight;
  int hh = itemheight - LEADING;

  if (eraseit && n != selected) {
    fl_push_clip(xx+1, yy-(LEADING-2)/2, ww-2, hh+(LEADING-2));
    draw_box(box(), 0, 0, w(), h(), button ? button->color() : color());
    fl_pop_clip();
  }

  m->draw(xx, yy, ww, hh, button, n==selected);

  // the shortcuts and arrows assume fl_color() was left set by draw():
  if (m->submenu()) {
    int sz = (hh-7)&-2;
    int y1 = yy+(hh-sz)/2;
    int x1 = xx+ww-sz-3;
    fl_polygon(x1+2, y1, x1+2, y1+sz, x1+sz/2+2, y1+sz/2);
  } else if (m->shortcut_) {
    Fl_Font f = m->labelsize_ || m->labelfont_ ? (Fl_Font)m->labelfont_ :
                    button ? button->textfont() : FL_HELVETICA;
    fl_font(f, m->labelsize_ ? m->labelsize_ :
                   button ? button->textsize() : FL_NORMAL_SIZE);
    const char *k, *s = fl_shortcut_label(m->shortcut_, &k);
    if (fl_utf_nb_char((const unsigned char*)k, (int) strlen(k))<=4) {
      // right-align the modifiers and left-align the key
      char *buf = (char*)malloc(k-s+1);
      memcpy(buf, s, k-s); buf[k-s] = 0;
      fl_draw(buf, xx, yy, ww-shortcutWidth, hh, FL_ALIGN_RIGHT);
      fl_draw(  k, xx+ww-shortcutWidth, yy, shortcutWidth, hh, FL_ALIGN_LEFT);
      free(buf);
    } else {
      // right-align to the menu
      fl_draw(s, xx, yy, ww-4, hh, FL_ALIGN_RIGHT);
    }
  }

  if (m->flags & FL_MENU_DIVIDER) {
    fl_color(FL_DARK3);
    fl_xyline(BW-1, yy+hh+(LEADING-2)/2, W-2*BW+2);
    fl_color(FL_LIGHT3);
    fl_xyline(BW-1, yy+hh+((LEADING-2)/2+1), W-2*BW+2);
  }
}